

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

CURLcode ssl_cf_shutdown(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  long *plVar1;
  long lVar2;
  curl_trc_feat *pcVar3;
  byte bVar4;
  CURLcode CVar5;
  
  plVar1 = (long *)cf->ctx;
  *done = true;
  CVar5 = CURLE_OK;
  if (((((cf->field_0x24 & 1) != 0) && ((cf->field_0x24 & 2) == 0)) && ((int)plVar1[0x17] == 3)) &&
     (CVar5 = CURLE_OK,
     Curl_ssl->shut_down != (_func_CURLcode_Curl_cfilter_ptr_Curl_easy_ptr__Bool__Bool_ptr *)0x0)) {
    lVar2 = plVar1[9];
    plVar1[9] = (long)data;
    CVar5 = (**(code **)(*plVar1 + 0x38))(cf,data,1,done);
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))))
       && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"cf_shutdown -> %d, done=%d",(ulong)CVar5,(ulong)*done);
    }
    *(long *)((long)cf->ctx + 0x48) = lVar2;
    bVar4 = 2;
    if (CVar5 == CURLE_OK) {
      bVar4 = *done * '\x02';
    }
    cf->field_0x24 = cf->field_0x24 & 0xfd | bVar4;
  }
  return CVar5;
}

Assistant:

static CURLcode ssl_cf_shutdown(struct Curl_cfilter *cf,
                                struct Curl_easy *data,
                                bool *done)
{
  struct ssl_connect_data *connssl = cf->ctx;
  CURLcode result = CURLE_OK;

  *done = TRUE;
  /* If we have done the SSL handshake, shut down the connection cleanly */
  if(cf->connected && (connssl->state == ssl_connection_complete) &&
    !cf->shutdown && Curl_ssl->shut_down) {
    struct cf_call_data save;

    CF_DATA_SAVE(save, cf, data);
    result = connssl->ssl_impl->shut_down(cf, data, TRUE, done);
    CURL_TRC_CF(data, cf, "cf_shutdown -> %d, done=%d", result, *done);
    CF_DATA_RESTORE(cf, save);
    cf->shutdown = (result || *done);
  }
  return result;
}